

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_cod.c
# Opt level: O1

int pnm_maxvaltodepth(uint_fast32_t maxval)

{
  long lVar1;
  int iVar2;
  
  lVar1 = 0x3f;
  if (maxval != 0) {
    for (; maxval >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar2 = 0;
  if (maxval != 0) {
    iVar2 = ((uint)lVar1 ^ 0xffffffc0) + 0x41;
  }
  return iVar2;
}

Assistant:

int pnm_maxvaltodepth(uint_fast32_t maxval)
{
	int n;

	n = 0;
	while (maxval > 0) {
		maxval >>= 1;
		++n;
	}
	return n;
}